

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O3

void __thiscall Control::convertUnits(Control *this,Network *network)

{
  int iVar1;
  Link *pLVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  
  iVar1 = *(int *)&(this->super_Element).field_0x2c;
  if (iVar1 == 1) {
    this->head = this->head / (network->units).factors[4] + this->node->elev;
  }
  else if (iVar1 == 0) {
    dVar3 = this->head / (network->units).factors[1] + (((Tank *)this->node)->super_Node).elev;
    this->head = dVar3;
    dVar3 = Tank::findVolume((Tank *)this->node,dVar3);
    this->volume = dVar3;
  }
  pLVar2 = this->link;
  if (pLVar2 != (Link *)0x0) {
    (*(pLVar2->super_Element)._vptr_Element[5])(this->setting,pLVar2,network);
    this->setting = extraout_XMM0_Qa;
  }
  return;
}

Assistant:

void Control::convertUnits(Network* network)
{
    if ( type == TANK_LEVEL )
    {
        Tank* tank = static_cast<Tank*>(node);
        head = head / network->ucf(Units::LENGTH) + node->elev;
        volume = tank->findVolume(head);
    }

    else if ( type == PRESSURE_LEVEL )
    {
        head = head / network->ucf(Units::PRESSURE) + node->elev;
    }

    if ( link ) setting = link->convertSetting(network, setting);
}